

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBinFromMatArray::load
          (Mat *__return_storage_ptr__,ModelBinFromMatArray *this,int param_1,int param_2)

{
  if (this->weights == (Mat *)0x0) {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->cstep = 0;
  }
  else {
    Mat::Mat(__return_storage_ptr__,this->weights);
    this->weights = this->weights + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromMatArray::load(int /*w*/, int /*type*/) const
{
    if (!weights)
        return Mat();

    Mat m = weights[0];
    weights++;
    return m;
}